

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O1

nodetree * NodeTree_CreateChild(void *p,tchar_t *Name,fourcc_t ClassId,void *Before)

{
  nodetree *pnVar1;
  
  pnVar1 = (nodetree *)NodeCreate(p,ClassId);
  if (pnVar1 != (nodetree *)0x0) {
    (**(code **)((long)(pnVar1->Base).VMT + 0x48))(pnVar1,p,Before);
    if ((Name != (tchar_t *)0x0) && (*Name != '\0')) {
      (**(code **)((long)(pnVar1->Base).VMT + 0x40))(pnVar1,5,4,Name);
    }
  }
  return pnVar1;
}

Assistant:

NOINLINE nodetree* NodeTree_CreateChild(void* p, const tchar_t* Name, fourcc_t ClassId, void* Before)
{
    nodetree* Child = (nodetree*)NodeCreate(p,ClassId);
    if (Child)
    {
        NodeTree_SetParent(Child,p,Before);
        if (Name && Name[0])
            Node_SetData((node*)Child,NODE_ID,TYPE_STRING,Name);
    }
    return Child;
}